

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicLibraryManager.cpp
# Opt level: O1

Symbol __thiscall
CppUnit::DynamicLibraryManager::findSymbol(DynamicLibraryManager *this,string *symbol)

{
  Symbol pvVar1;
  DynamicLibraryManagerException *this_00;
  
  pvVar1 = doFindSymbol(this,symbol);
  if (pvVar1 != (Symbol)0x0) {
    return pvVar1;
  }
  this_00 = (DynamicLibraryManagerException *)__cxa_allocate_exception(0x38);
  DynamicLibraryManagerException::DynamicLibraryManagerException
            (this_00,&this->m_libraryName,symbol,symbolNotFound);
  __cxa_throw(this_00,&DynamicLibraryManagerException::typeinfo,
              DynamicLibraryManagerException::~DynamicLibraryManagerException);
}

Assistant:

DynamicLibraryManager::Symbol 
DynamicLibraryManager::findSymbol( const std::string &symbol )
{
  try
  {
    Symbol symbolPointer = doFindSymbol( symbol );
    if ( symbolPointer != NULL )
      return symbolPointer;
  }
  catch ( ... )
  {
  }

  throw DynamicLibraryManagerException( m_libraryName, 
                                        symbol,
                                        DynamicLibraryManagerException::symbolNotFound );
  return NULL;    // keep compiler happy
}